

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.test.h
# Opt level: O2

void my_algorithm::testWeightDigraphAlgorithm(void)

{
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *pWVar1;
  pointer pWVar2;
  bool bVar3;
  int iVar4;
  WeightedDigraph<int,_int> *pWVar5;
  ostream *poVar6;
  int iVar7;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *pWVar8;
  int local_208 [24];
  _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_1a8;
  int local_18c [3];
  WeightedDigraph<int,_int> graph;
  WeightedDigraphSPAcyclic<int,_int> a_sp_ac;
  WeightedDigraphSPDijkstra<int,_int> a_sp_dij;
  
  data_structures::WeightedDigraph<int,_int>::WeightedDigraph
            ((WeightedDigraph<int,_int> *)&graph.super_WeightedGraph<int,_int>);
  for (a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = 0;
      (int)a_sp_ac._vptr_WeightedDigraphSPAcyclic < 8;
      a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = (int)a_sp_ac._vptr_WeightedDigraphSPAcyclic + 1
      ) {
    data_structures::WeightedGraph<int,_int>::addVertex
              (&graph.super_WeightedGraph<int,_int>,(int *)&a_sp_ac);
  }
  a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = 4;
  a_sp_dij._vptr_WeightedDigraphSPDijkstra._0_4_ = 5;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (&graph,(int *)&a_sp_ac,(int *)&a_sp_dij,0x23);
  local_1a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  local_208[0x17] = 4;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,(int *)&local_1a8,local_208 + 0x17,0x23);
  local_208[0x16] = 4;
  local_208[0x15] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x16,local_208 + 0x15,0x25);
  local_208[0x14] = 5;
  local_208[0x13] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x14,local_208 + 0x13,0x1c);
  local_208[0x12] = 7;
  local_208[0x11] = 5;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x12,local_208 + 0x11,0x1c);
  local_208[0x10] = 5;
  local_208[0xf] = 1;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x10,local_208 + 0xf,0x20);
  local_208[0xe] = 0;
  local_208[0xd] = 4;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0xe,local_208 + 0xd,0x26);
  local_208[0xc] = 0;
  local_208[0xb] = 2;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0xc,local_208 + 0xb,0x1a);
  local_208[10] = 7;
  local_208[9] = 3;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 10,local_208 + 9,0x27);
  local_208[8] = 1;
  local_208[7] = 3;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 8,local_208 + 7,0x1d);
  local_208[6] = 2;
  local_208[5] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 6,local_208 + 5,0x22);
  local_208[4] = 6;
  local_208[3] = 2;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 4,local_208 + 3,0x28);
  local_208[2] = 3;
  local_208[1] = 6;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 2,local_208 + 1,0x34);
  local_208[0] = 6;
  local_18c[2] = 0;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge(pWVar5,local_208,local_18c + 2,0x3a);
  local_18c[1] = 6;
  local_18c[0] = 4;
  data_structures::WeightedDigraph<int,_int>::addEdge(pWVar5,local_18c + 1,local_18c,0x5d);
  poVar6 = data_structures::operator<<((ostream *)&std::cout,&graph);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"<---- WeightedDigraphSPDijkstra ---->");
  std::endl<char,std::char_traits<char>>(poVar6);
  WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra(&a_sp_dij,&graph,0);
  for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
    bVar3 = WeightedDigraphSPDijkstra<int,_int>::hasPathTo(&a_sp_dij,iVar7);
    if (bVar3) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      poVar6 = std::operator<<(poVar6," to ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar7);
      poVar6 = std::operator<<(poVar6,":");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"weight: ");
      iVar4 = WeightedDigraphSPDijkstra<int,_int>::weightTo(&a_sp_dij,iVar7);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar4);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"path: ");
      WeightedDigraphSPDijkstra<int,_int>::pathTo
                ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *)&a_sp_ac,&a_sp_dij,iVar7);
      pWVar1 = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
                *)CONCAT44(a_sp_ac._12_4_,a_sp_ac._start);
      for (pWVar8 = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
                     *)CONCAT44(a_sp_ac._vptr_WeightedDigraphSPAcyclic._4_4_,
                                (int)a_sp_ac._vptr_WeightedDigraphSPAcyclic); pWVar8 != pWVar1;
          pWVar8 = pWVar8 + 1) {
        poVar6 = data_structures::operator<<((ostream *)&std::cout,pWVar8);
        std::operator<<(poVar6," ");
      }
      std::
      _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~_Vector_base((_Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                       *)&a_sp_ac);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar6);
  data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::clear
            (&graph.super_WeightedGraph<int,_int>._tree);
  for (a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = 0;
      (int)a_sp_ac._vptr_WeightedDigraphSPAcyclic < 8;
      a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = (int)a_sp_ac._vptr_WeightedDigraphSPAcyclic + 1
      ) {
    data_structures::WeightedGraph<int,_int>::addVertex
              (&graph.super_WeightedGraph<int,_int>,(int *)&a_sp_ac);
  }
  a_sp_ac._vptr_WeightedDigraphSPAcyclic._0_4_ = 5;
  local_1a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (&graph,(int *)&a_sp_ac,(int *)&local_1a8,0x23);
  local_208[0x17] = 4;
  local_208[0x16] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x17,local_208 + 0x16,0x25);
  local_208[0x15] = 5;
  local_208[0x14] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x15,local_208 + 0x14,0x1c);
  local_208[0x13] = 5;
  local_208[0x12] = 1;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x13,local_208 + 0x12,0x20);
  local_208[0x11] = 4;
  local_208[0x10] = 0;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0x11,local_208 + 0x10,0x26);
  local_208[0xf] = 0;
  local_208[0xe] = 2;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0xf,local_208 + 0xe,0x1a);
  local_208[0xd] = 3;
  local_208[0xc] = 7;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0xd,local_208 + 0xc,0x27);
  local_208[0xb] = 1;
  local_208[10] = 3;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 0xb,local_208 + 10,0x1d);
  local_208[9] = 7;
  local_208[8] = 2;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 9,local_208 + 8,0x22);
  local_208[7] = 6;
  local_208[6] = 2;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 7,local_208 + 6,0x28);
  local_208[5] = 3;
  local_208[4] = 6;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 5,local_208 + 4,0x34);
  local_208[3] = 6;
  local_208[2] = 0;
  pWVar5 = data_structures::WeightedDigraph<int,_int>::addEdge
                     (pWVar5,local_208 + 3,local_208 + 2,0x3a);
  local_208[1] = 6;
  local_208[0] = 4;
  data_structures::WeightedDigraph<int,_int>::addEdge(pWVar5,local_208 + 1,local_208,0x5d);
  poVar6 = data_structures::operator<<((ostream *)&std::cout,&graph);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"<---- WeightedDigraphSPAcyclic ---->");
  std::endl<char,std::char_traits<char>>(poVar6);
  WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic(&a_sp_ac,&graph);
  for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
    bVar3 = WeightedDigraphSPAcyclic<int,_int>::hasPathTo(&a_sp_ac,iVar7);
    if (bVar3) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a_sp_ac._start);
      poVar6 = std::operator<<(poVar6," to ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar7);
      poVar6 = std::operator<<(poVar6,":");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"weight: ");
      iVar4 = WeightedDigraphSPAcyclic<int,_int>::weightTo(&a_sp_ac,iVar7);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar4);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"path: ");
      WeightedDigraphSPAcyclic<int,_int>::pathTo
                ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *)&local_1a8,&a_sp_ac,iVar7);
      pWVar2 = local_1a8._M_impl.super__Vector_impl_data._M_finish;
      for (pWVar8 = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
                     *)CONCAT44(local_1a8._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_1a8._M_impl.super__Vector_impl_data._M_start._0_4_);
          pWVar8 != pWVar2; pWVar8 = pWVar8 + 1) {
        poVar6 = data_structures::operator<<((ostream *)&std::cout,pWVar8);
        std::operator<<(poVar6," ");
      }
      std::
      _Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~_Vector_base(&local_1a8);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  WeightedDigraphSPAcyclic<int,_int>::~WeightedDigraphSPAcyclic(&a_sp_ac);
  WeightedDigraphSPDijkstra<int,_int>::~WeightedDigraphSPDijkstra(&a_sp_dij);
  data_structures::WeightedGraph<int,_int>::~WeightedGraph(&graph.super_WeightedGraph<int,_int>);
  return;
}

Assistant:

void testWeightDigraphAlgorithm() {
        WeightedDigraph<int, int> graph;
        for (int i = 0; i <= 7; i++) {
            graph.addVertex(i);
        }

        graph.addEdge(4, 5, 35)
            .addEdge(5, 4, 35)
            .addEdge(4, 7, 37)
            .addEdge(5, 7, 28)
            .addEdge(7, 5, 28)
            .addEdge(5, 1, 32)
            .addEdge(0, 4, 38)
            .addEdge(0, 2, 26)
            .addEdge(7, 3, 39)
            .addEdge(1, 3, 29)
            .addEdge(2, 7, 34)
            .addEdge(6, 2, 40)
            .addEdge(3, 6, 52)
            .addEdge(6, 0, 58)
            .addEdge(6, 4, 93);

        cout << graph << endl;

        cout << "<---- WeightedDigraphSPDijkstra ---->" << endl;
        auto a_sp_dij = WeightedDigraphSPDijkstra<int, int>(graph, 0);
        for (int i = 0; i <= 7; i++) {
            if (!a_sp_dij.hasPathTo(i)) {
                continue;
            }
            cout << 0 << " to " << i << ":" << endl;
            cout << "weight: " << a_sp_dij.weightTo(i) << endl;
            cout << "path: ";
            for (auto &edge: a_sp_dij.pathTo(i)) {
                cout << edge << " ";
            }
            cout << endl;
        }

        cout << endl << endl;

        graph.clear();
        for (int i = 0; i <= 7; i++) {
            graph.addVertex(i);
        }
        graph.addEdge(5, 4, 35)
            .addEdge(4, 7, 37)
            .addEdge(5, 7, 28)
            .addEdge(5, 1, 32)
            .addEdge(4, 0, 38)
            .addEdge(0, 2, 26)
            .addEdge(3, 7, 39)
            .addEdge(1, 3, 29)
            .addEdge(7, 2, 34)
            .addEdge(6, 2, 40)
            .addEdge(3, 6, 52)
            .addEdge(6, 0, 58)
            .addEdge(6, 4, 93);

        cout << graph << endl;

        cout << "<---- WeightedDigraphSPAcyclic ---->" << endl;
        auto a_sp_ac = WeightedDigraphSPAcyclic<int, int>(graph);
        auto start = a_sp_ac.start();
        for (int i = 0; i <= 7; i++) {
            if (!a_sp_ac.hasPathTo(i)) {
                continue;
            }
            cout << start << " to " << i << ":" << endl;
            cout << "weight: " << a_sp_ac.weightTo(i) << endl;
            cout << "path: ";
            for (auto &edge: a_sp_ac.pathTo(i)) {
                cout << edge << " ";
            }
            cout << endl;
        }

    }